

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_tri_normdev_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_normdev)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  REF_INT cell;
  char *pcVar6;
  ulong uVar7;
  double dVar8;
  REF_DBL normdev;
  REF_INT nodes [27];
  
  ref_cell = ref_grid->cell[3];
  *min_normdev = 2.0;
  uVar7 = 0xffffffff;
  cell = -1;
  if (-1 < node) {
    pRVar1 = ref_cell->ref_adj;
    uVar7 = 0xffffffff;
    cell = -1;
    if (node < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)node];
      uVar7 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar1->item[(int)uVar4].ref;
        uVar7 = (ulong)uVar4;
      }
    }
  }
  bVar3 = false;
  while( true ) {
    if ((int)uVar7 == -1) {
      if (!bVar3) {
        *min_normdev = -2.0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0xd3,"ref_smooth_tri_normdev_around","no triangle found, can not compute normdev");
      }
      return (uint)!bVar3;
    }
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) break;
    uVar4 = ref_geom_tri_norm_deviation(ref_grid,nodes,&normdev);
    if (uVar4 != 0) {
      if (uVar4 == 4) {
        *min_normdev = -1.5;
        return 0;
      }
      pcVar6 = "ref_geom_tri_norm_deviation";
      uVar5 = 0xcd;
      goto LAB_001dbd73;
    }
    dVar8 = *min_normdev;
    if (normdev <= *min_normdev) {
      dVar8 = normdev;
    }
    *min_normdev = dVar8;
    pRVar2 = ref_cell->ref_adj->item;
    uVar7 = (ulong)pRVar2[(int)uVar7].next;
    bVar3 = true;
    cell = -1;
    if (uVar7 != 0xffffffffffffffff) {
      cell = pRVar2[uVar7].ref;
    }
  }
  pcVar6 = "nodes";
  uVar5 = 0xc6;
LAB_001dbd73:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar5,
         "ref_smooth_tri_normdev_around",(ulong)uVar4,pcVar6);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_normdev_around(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *min_normdev) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL normdev;
  REF_STATUS status;

  *min_normdev = 2.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    none_found = REF_FALSE;
    status = ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev);
    if (REF_DIV_ZERO == status) {
      *min_normdev = -1.5;
      return REF_SUCCESS;
    }
    RSS(status, "ref_geom_tri_norm_deviation");
    *min_normdev = MIN(*min_normdev, normdev);
  }

  if (none_found) {
    *min_normdev = -2.0;
    THROW("no triangle found, can not compute normdev");
  }

  return REF_SUCCESS;
}